

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

ssize_t __thiscall
booster::aio::stream_socket::read(stream_socket *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t n;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  mutable_buffer tmp;
  buffer_impl<char_*> local_50;
  
  buffer_impl<char_*>::buffer_impl
            (&local_50,(buffer_impl<char_*> *)CONCAT44(in_register_00000034,__fd));
  sVar1 = 0;
  while (local_50.size_ != 0) {
    n = read_some(this,(mutable_buffer *)&local_50,(error_code *)__buf);
    sVar1 = sVar1 + n;
    if (*__buf != 0) break;
    operator+=((mutable_buffer *)&local_50,n);
  }
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_50.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return sVar1;
}

Assistant:

size_t stream_socket::read(mutable_buffer const &buffer,system::error_code &e)
{
	mutable_buffer tmp = buffer;
	size_t count = 0;
	while(!tmp.empty()) {
		size_t n = read_some(tmp,e);
		count+=n;
		if(e) return count;
		tmp+=n;
	}
	return count;
}